

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O3

void __thiscall
CheckQueueTest::Correct_Queue_range
          (CheckQueueTest *this,vector<unsigned_long,_std::allocator<unsigned_long>_> range)

{
  long lVar1;
  ulong *puVar2;
  readonly_property<bool> rVar3;
  __uniq_ptr_data<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>,_true,_true>
  this_00;
  pointer __new_size;
  long *in_RSI;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  ulong *puVar6;
  pointer pFVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar8;
  undefined1 local_160 [16];
  undefined1 *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  size_t i;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  __single_object small_queue;
  size_t *local_c0;
  assertion_result local_b8;
  size_t **local_a0;
  atomic<unsigned_long> *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  atomic<unsigned_long> **local_78;
  char *local_70;
  char *local_68;
  assertion_result local_60;
  CCheckQueueControl<FakeCheckCheckCompletion> control;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.
  super___uniq_ptr_impl<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
  .super__Head_base<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
        )operator_new(0x100);
  CCheckQueue<FakeCheckCheckCompletion>::CCheckQueue
            ((CCheckQueue<FakeCheckCheckCompletion> *)
             this_00.
             super___uniq_ptr_impl<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
             .super__Head_base<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_false>._M_head_impl,
             0x80,3);
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  small_queue._M_t.
  super___uniq_ptr_impl<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
  .super__Head_base<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_false>._M_head_impl =
       (__uniq_ptr_data<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>,_true,_true>
        )(__uniq_ptr_data<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
           .super__Head_base<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_false>._M_head_impl;
  std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::reserve
            (&vChecks,9);
  puVar6 = (ulong *)*in_RSI;
  puVar2 = (ulong *)in_RSI[1];
  if (puVar6 != puVar2) {
    do {
      pFVar7 = (pointer)*puVar6;
      LOCK();
      FakeCheckCheckCompletion::n_calls.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)0;
      UNLOCK();
      i = (size_t)pFVar7;
      CCheckQueueControl<FakeCheckCheckCompletion>::CCheckQueueControl
                (&control,(CCheckQueue<FakeCheckCheckCompletion> *)
                          small_queue._M_t.
                          super___uniq_ptr_impl<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
                          .super__Head_base<0UL,_CCheckQueue<FakeCheckCheckCompletion>_*,_false>.
                          _M_head_impl);
      while (pFVar7 != (pointer)0x0) {
        if (vChecks.
            super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            vChecks.
            super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          vChecks.
          super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               vChecks.
               super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        do {
          __new_size = (pointer)RandomMixin<FastRandomContext>::randbits
                                          (&(this->super_NoLockLoggingTestingSetup).
                                            super_TestingSetup.super_ChainTestingSetup.
                                            super_BasicTestingSetup.m_rng.
                                            super_RandomMixin<FastRandomContext>,4);
        } while ((pointer)0x9 < __new_size);
        if (pFVar7 <= __new_size) {
          __new_size = pFVar7;
        }
        std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::resize
                  (&vChecks,(size_type)__new_size);
        pFVar7 = vChecks.
                 super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 ((long)pFVar7 -
                 (long)vChecks.
                       super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
        if (control.pqueue != (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
          CCheckQueue<FakeCheckCheckCompletion>::Add(control.pqueue,&vChecks);
        }
      }
      local_100 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_f8 = "";
      local_110 = &boost::unit_test::basic_cstring<char_const>::null;
      local_108 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar8 = 0x30fa2b;
      file.m_end = (iterator)0xb1;
      file.m_begin = (iterator)&local_100;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_110,msg)
      ;
      if (control.pqueue == (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
        rVar3.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        _cVar8 = 0x30fa42;
        rVar3.super_class_property<bool>.value =
             (class_property<bool>)CCheckQueue<FakeCheckCheckCompletion>::Loop(control.pqueue,true);
        control.fDone = true;
      }
      local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
      local_b8.m_message.px = (element_type *)0x0;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_160._0_8_ = "control.Wait()";
      local_160._8_8_ = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = (atomic<unsigned_long> **)local_160;
      local_120 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_118 = "";
      pvVar4 = (iterator)0x2;
      pvVar5 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_b8,&local_90,2,0,WARN,_cVar8,(size_t)&local_120,0xb1);
      boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
      local_130 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_128 = "";
      local_140 = &boost::unit_test::basic_cstring<char_const>::null;
      local_138 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xb2;
      file_00.m_begin = (iterator)&local_130;
      msg_00.m_end = pvVar5;
      msg_00.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
                 msg_00);
      local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
      local_160._0_8_ = &PTR__lazy_ostream_01388f08;
      local_150 = boost::unit_test::lazy_ostream::inst;
      local_148 = "";
      local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (FakeCheckCheckCompletion::n_calls.super___atomic_base<unsigned_long>._M_i ==
           (__atomic_base<unsigned_long>)i);
      local_60.m_message.px = (element_type *)0x0;
      local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_70 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_68 = "";
      local_98 = &FakeCheckCheckCompletion::n_calls;
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0138a1d0;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_98;
      local_c0 = &i;
      local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
      local_b8._0_8_ = &PTR__lazy_ostream_01388f48;
      local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_a0 = &local_c0;
      in_R8 = (iterator)0x2;
      in_R9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_60,(lazy_ostream *)local_160,2,2,REQUIRE,0xe49b9d,(size_t)&local_70,0xb2,
                 &local_90,"i",&local_b8);
      boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
      CCheckQueueControl<FakeCheckCheckCompletion>::~CCheckQueueControl(&control);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  if (vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vChecks.
                    super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vChecks.
                          super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vChecks.
                          super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  unique_ptr<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
  ::~unique_ptr(&small_queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckQueueTest::Correct_Queue_range(std::vector<size_t> range)
{
    auto small_queue = std::make_unique<Correct_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    // Make vChecks here to save on malloc (this test can be slow...)
    std::vector<FakeCheckCheckCompletion> vChecks;
    vChecks.reserve(9);
    for (const size_t i : range) {
        size_t total = i;
        FakeCheckCheckCompletion::n_calls = 0;
        CCheckQueueControl<FakeCheckCheckCompletion> control(small_queue.get());
        while (total) {
            vChecks.clear();
            vChecks.resize(std::min<size_t>(total, m_rng.randrange(10)));
            total -= vChecks.size();
            control.Add(std::move(vChecks));
        }
        BOOST_REQUIRE(control.Wait());
        BOOST_REQUIRE_EQUAL(FakeCheckCheckCompletion::n_calls, i);
    }
}